

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O3

bool __thiscall
glu::SubTypeIterator<glu::IsBasicType>::operator!=
          (SubTypeIterator<glu::IsBasicType> *this,SubTypeIterator<glu::IsBasicType> *other)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  long lVar4;
  pointer pVVar5;
  bool bVar6;
  
  bVar6 = true;
  if (this->m_type == other->m_type) {
    pVVar1 = (this->m_path).
             super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pVVar2 = (this->m_path).
             super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pVVar3 = (other->m_path).
             super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)pVVar2 - (long)pVVar1 ==
        (long)(other->m_path).
              super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)pVVar3) {
      if (pVVar1 == pVVar2) {
        return false;
      }
      lVar4 = 0;
      do {
        bVar6 = *(int *)((long)&pVVar3->index + lVar4) != *(int *)((long)&pVVar1->index + lVar4) ||
                *(int *)((long)&pVVar1->type + lVar4) != *(int *)((long)&pVVar3->type + lVar4);
        if (bVar6) {
          return bVar6;
        }
        pVVar5 = (pointer)((long)&pVVar1[1].type + lVar4);
        lVar4 = lVar4 + 8;
      } while (pVVar5 != pVVar2);
    }
  }
  return bVar6;
}

Assistant:

bool								operator!=			(const SubTypeIterator<IsExpanded>& other) const { return m_type != other.m_type || m_path != other.m_path; }